

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_junit_xml_tests.cpp
# Opt level: O0

void __thiscall
iu_ParamTest_x_iutest_x_Test_Test::iu_ParamTest_x_iutest_x_Test_Test
          (iu_ParamTest_x_iutest_x_Test_Test *this)

{
  iu_ParamTest_x_iutest_x_Test_Test *this_local;
  
  ParamTest::ParamTest(&this->super_type);
  (this->super_type).super_TestWithParam<int>.super_Test._vptr_Test =
       (_func_int **)&PTR__iu_ParamTest_x_iutest_x_Test_Test_001894d8;
  (this->super_type).super_TestWithParam<int>.super_WithParamInterface<int>._vptr_WithParamInterface
       = (_func_int **)&PTR__iu_ParamTest_x_iutest_x_Test_Test_00189518;
  return;
}

Assistant:

IUTEST_P(ParamTest, Test)
{
}